

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_> __thiscall
Parser::parseFunctionCallStatement(Parser *this,optional<Token> *identifierToken)

{
  Mark *pMVar1;
  pointer this_00;
  __uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
  in_RDI;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> functionCall;
  Mark mark;
  __single_object *node;
  optional<Token> *in_stack_00000110;
  Parser *in_stack_00000118;
  optional<Token> *in_stack_ffffffffffffff28;
  optional<Token> *in_stack_ffffffffffffff30;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *this_01;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  allocator<char> in_stack_ffffffffffffff67;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffffb0;
  TokenType in_stack_ffffffffffffffbc;
  Parser *in_stack_ffffffffffffffc0;
  Mark local_20 [4];
  
  pMVar1 = Tokenizer::getMark((Tokenizer *)0x19de43);
  local_20[0] = *pMVar1;
  std::optional<Token>::optional(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  parseFunctionCall(in_stack_00000118,in_stack_00000110);
  std::optional<Token>::~optional((optional<Token> *)0x19de85);
  this_01 = (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
            &stack0xffffffffffffff67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)));
  expectToken(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  std::
  make_unique<FunctionCallStatementNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            (in_stack_ffffffffffffff68);
  this_00 = std::
            unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_>::
            operator->((unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_>
                        *)0x19def9);
  Node::setMark((Node *)this_00,local_20);
  std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr(this_01);
  return (__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
          )(tuple<FunctionCallStatementNode_*,_std::default_delete<FunctionCallStatementNode>_>)
           in_RDI.
           super___uniq_ptr_impl<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_FunctionCallStatementNode_*,_std::default_delete<FunctionCallStatementNode>_>
           .super__Head_base<0UL,_FunctionCallStatementNode_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FunctionCallStatementNode> Parser::parseFunctionCallStatement(std::optional<Token> identifierToken)
{
  const auto mark = tokenizer_.getMark();
  auto functionCall = parseFunctionCall(identifierToken);
  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<FunctionCallStatementNode>(std::move(functionCall));
  node->setMark(mark);
  return node;
}